

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::SearchFrameworkPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  cmFileList *pcVar4;
  bool bVar5;
  allocator<char> local_5c9;
  string local_5c8;
  cmFileListGeneratorCaseInsensitive local_5a8;
  allocator<char> local_571;
  string local_570;
  cmFileListGeneratorGlob local_550;
  allocator<char> local_519;
  string local_518;
  cmFileListGeneratorFixed local_4f8;
  cmFileListGeneratorMacProject local_4c8;
  string local_490;
  cmFileListGeneratorFixed local_470;
  undefined1 local_440 [8];
  cmFindPackageFileList lister_3;
  string local_410;
  cmFileListGeneratorGlob local_3f0;
  allocator<char> local_3b9;
  string local_3b8;
  cmFileListGeneratorFixed local_398;
  cmFileListGeneratorMacProject local_368;
  string local_330;
  cmFileListGeneratorFixed local_310;
  undefined1 local_2e0 [8];
  cmFindPackageFileList lister_2;
  string local_2b0;
  cmFileListGeneratorCaseInsensitive local_290;
  allocator<char> local_259;
  string local_258;
  cmFileListGeneratorFixed local_238;
  cmFileListGeneratorMacProject local_208;
  string local_1d0;
  cmFileListGeneratorFixed local_1b0;
  undefined1 local_180 [8];
  cmFindPackageFileList lister_1;
  string local_150;
  cmFileListGeneratorFixed local_130;
  cmFileListGeneratorMacProject local_100;
  string local_c8;
  cmFileListGeneratorFixed local_a8;
  undefined1 local_68 [8];
  cmFindPackageFileList lister;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar5 = false;
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    bVar5 = *pcVar2 == '/';
  }
  __stream = _stderr;
  if (bVar5) {
    if ((this->DebugMode & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Checking framework prefix [%s]\n",uVar3);
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&lister.UseSuffixes,(ulong)prefix_in);
    cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_68,this,true);
    std::__cxx11::string::string((string *)&local_c8,(string *)&lister.UseSuffixes);
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_a8,&local_c8);
    pcVar4 = cmFileList::operator/((cmFileList *)local_68,&local_a8.super_cmFileListGeneratorBase);
    cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
              (&local_100,&this->Names,".framework");
    pcVar4 = cmFileList::operator/(pcVar4,&local_100.super_cmFileListGeneratorBase);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Resources",(allocator<char> *)&lister_1.field_0x27);
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_130,&local_150);
    cmFileList::operator/(pcVar4,&local_130.super_cmFileListGeneratorBase);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&lister_1.field_0x27);
    cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_100);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_68);
    if (lister_1.UseSuffixes) {
      this_local._7_1_ = 1;
    }
    lister_1._33_3_ = 0;
    cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_68);
    if (lister_1._32_4_ == 0) {
      cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_180,this,true);
      std::__cxx11::string::string((string *)&local_1d0,(string *)&lister.UseSuffixes);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_1b0,&local_1d0);
      pcVar4 = cmFileList::operator/
                         ((cmFileList *)local_180,&local_1b0.super_cmFileListGeneratorBase);
      cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                (&local_208,&this->Names,".framework");
      pcVar4 = cmFileList::operator/(pcVar4,&local_208.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"Resources",&local_259);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_238,&local_258);
      pcVar4 = cmFileList::operator/(pcVar4,&local_238.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"cmake",(allocator<char> *)&lister_2.field_0x27);
      cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive(&local_290,&local_2b0);
      cmFileList::operator/(pcVar4,&local_290.super_cmFileListGeneratorBase);
      cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&lister_2.field_0x27);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_208);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_180);
      if (lister_1.UseSuffixes) {
        this_local._7_1_ = 1;
      }
      lister_1._33_3_ = 0;
      cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_180);
      if (lister_1._32_4_ == 0) {
        cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_2e0,this,true);
        std::__cxx11::string::string((string *)&local_330,(string *)&lister.UseSuffixes);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_310,&local_330);
        pcVar4 = cmFileList::operator/
                           ((cmFileList *)local_2e0,&local_310.super_cmFileListGeneratorBase);
        cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                  (&local_368,&this->Names,".framework");
        pcVar4 = cmFileList::operator/(pcVar4,&local_368.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"Versions",&local_3b9);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_398,&local_3b8);
        pcVar4 = cmFileList::operator/(pcVar4,&local_398.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"*/Resources",(allocator<char> *)&lister_3.field_0x27);
        cmFileListGeneratorGlob::cmFileListGeneratorGlob(&local_3f0,&local_410);
        cmFileList::operator/(pcVar4,&local_3f0.super_cmFileListGeneratorBase);
        cmFileListGeneratorGlob::~cmFileListGeneratorGlob(&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator((allocator<char> *)&lister_3.field_0x27);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator(&local_3b9);
        cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_368);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_2e0);
        if (lister_1.UseSuffixes) {
          this_local._7_1_ = 1;
        }
        lister_1._33_3_ = 0;
        cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_2e0);
        if (lister_1._32_4_ == 0) {
          cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_440,this,true)
          ;
          std::__cxx11::string::string((string *)&local_490,(string *)&lister.UseSuffixes);
          cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_470,&local_490);
          pcVar4 = cmFileList::operator/
                             ((cmFileList *)local_440,&local_470.super_cmFileListGeneratorBase);
          cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                    (&local_4c8,&this->Names,".framework");
          pcVar4 = cmFileList::operator/(pcVar4,&local_4c8.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_518,"Versions",&local_519);
          cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_4f8,&local_518);
          pcVar4 = cmFileList::operator/(pcVar4,&local_4f8.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_570,"*/Resources",&local_571);
          cmFileListGeneratorGlob::cmFileListGeneratorGlob(&local_550,&local_570);
          pcVar4 = cmFileList::operator/(pcVar4,&local_550.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,"cmake",&local_5c9);
          cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                    (&local_5a8,&local_5c8);
          cmFileList::operator/(pcVar4,&local_5a8.super_cmFileListGeneratorBase);
          cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_5a8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::allocator<char>::~allocator(&local_5c9);
          cmFileListGeneratorGlob::~cmFileListGeneratorGlob(&local_550);
          std::__cxx11::string::~string((string *)&local_570);
          std::allocator<char>::~allocator(&local_571);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_4f8);
          std::__cxx11::string::~string((string *)&local_518);
          std::allocator<char>::~allocator(&local_519);
          cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_4c8);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_470);
          std::__cxx11::string::~string((string *)&local_490);
          lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_440);
          if (lister_1.UseSuffixes) {
            this_local._7_1_ = 1;
          }
          lister_1._33_3_ = 0;
          cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_440);
          if (lister_1._32_4_ == 0) {
            this_local._7_1_ = 0;
            lister_1.UseSuffixes = true;
            lister_1._33_3_ = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&lister.UseSuffixes);
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFindPackageCommand.cxx"
                ,0x8a4,"bool cmFindPackageCommand::SearchFrameworkPrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchFrameworkPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');
  if (this->DebugMode) {
    fprintf(stderr, "Checking framework prefix [%s]\n", prefix_in.c_str());
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string prefix = prefix_in.substr(0, prefix_in.size() - 1);

  // <prefix>/Foo.framework/Resources/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Resources");
    if (lister.Search()) {
      return true;
    }
  }
  // <prefix>/Foo.framework/Resources/CMake/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Resources") /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // <prefix>/Foo.framework/Versions/*/Resources/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Versions") /
      cmFileListGeneratorGlob("*/Resources");
    if (lister.Search()) {
      return true;
    }
  }

  // <prefix>/Foo.framework/Versions/*/Resources/CMake/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Versions") /
      cmFileListGeneratorGlob("*/Resources") /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  return false;
}